

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_mus_opl.cpp
# Opt level: O0

void __thiscall OPLMUSSong::Play(OPLMUSSong *this,bool looping,int subsong)

{
  SoundStream *pSVar1;
  uint uVar2;
  int subsong_local;
  bool looping_local;
  OPLMUSSong *this_local;
  
  (this->super_StreamSong).super_MusInfo.m_Status = STATE_Stopped;
  (this->super_StreamSong).super_MusInfo.m_Looping = looping;
  OPLmusicFile::SetLooping(this->Music,looping);
  (*(this->Music->super_OPLmusicBlock)._vptr_OPLmusicBlock[2])();
  if ((this->super_StreamSong).m_Stream != (SoundStream *)0x0) {
    pSVar1 = (this->super_StreamSong).m_Stream;
    FFloatCVar::operator_cast_to_float(&snd_musicvolume);
    uVar2 = (*pSVar1->_vptr_SoundStream[2])(pSVar1,1);
    if ((uVar2 & 1) == 0) {
      return;
    }
  }
  (this->super_StreamSong).super_MusInfo.m_Status = STATE_Playing;
  return;
}

Assistant:

void OPLMUSSong::Play (bool looping, int subsong)
{
	m_Status = STATE_Stopped;
	m_Looping = looping;

	Music->SetLooping (looping);
	Music->Restart ();

	if (m_Stream == NULL || m_Stream->Play (true, snd_musicvolume))
	{
		m_Status = STATE_Playing;
	}
}